

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::TrimMessage
          (FieldMaskTree *this,Node *node,Message *message)

{
  FieldDescriptor *field;
  long lVar1;
  FieldMaskTree *this_00;
  Reflection *this_01;
  bool bVar2;
  CppType CVar3;
  int iVar4;
  LogMessage *other;
  const_iterator cVar5;
  Node *node_00;
  Reflection *extraout_RDX;
  Message *message_00;
  ulong uVar6;
  LogMessage local_a0;
  ulong local_68;
  long local_60;
  _Base_ptr local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
  *local_50;
  Reflection *local_48;
  undefined8 local_40;
  LogFinisher local_31;
  
  local_50 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              *)this;
  if ((this->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_mask_util.cc"
               ,0x24d);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_a0,"CHECK failed: !node->children.empty(): ");
    protobuf::internal::LogFinisher::operator=(&local_31,other);
    protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  (**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  local_60 = (**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  local_58 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
                 *)&(local_50->_M_t)._M_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  uVar6 = 0;
  local_68 = (ulong)*(uint *)(local_60 + 0x68);
  if ((int)*(uint *)(local_60 + 0x68) < 1) {
    local_68 = uVar6;
  }
  local_68 = local_68 * 0x98;
  local_40 = 0;
  local_48 = extraout_RDX;
  for (; local_68 != uVar6; uVar6 = uVar6 + 0x98) {
    lVar1 = *(long *)(local_60 + 0x28);
    field = (FieldDescriptor *)(lVar1 + uVar6);
    cVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
            ::find(local_50,*(key_type **)(lVar1 + uVar6));
    this_01 = local_48;
    if (cVar5._M_node == local_58) {
      if (*(int *)(lVar1 + 0x3c + uVar6) == 3) {
        iVar4 = Reflection::FieldSize(local_48,(Message *)node,field);
        bVar2 = iVar4 != 0;
      }
      else {
        bVar2 = Reflection::HasField(local_48,(Message *)node,field);
      }
      local_40 = CONCAT71((int7)((ulong)local_40 >> 8),(byte)local_40 | bVar2);
      Reflection::ClearField(this_01,(Message *)node,field);
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(field);
      if ((CVar3 == CPPTYPE_MESSAGE) &&
         (this_00 = *(FieldMaskTree **)(cVar5._M_node + 2),
         (this_00->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        bVar2 = Reflection::HasField(local_48,(Message *)node,field);
        if (bVar2) {
          node_00 = (Node *)Reflection::MutableMessage
                                      (local_48,(Message *)node,field,(MessageFactory *)0x0);
          bVar2 = TrimMessage(this_00,node_00,message_00);
          local_40 = CONCAT71((int7)((ulong)local_40 >> 8),(byte)local_40 | bVar2);
        }
      }
    }
  }
  return (bool)((byte)local_40 & 1);
}

Assistant:

bool FieldMaskTree::TrimMessage(const Node* node, Message* message) {
  GOOGLE_DCHECK(!node->children.empty());
  const Reflection* reflection = message->GetReflection();
  const Descriptor* descriptor = message->GetDescriptor();
  const int32 field_count = descriptor->field_count();
  bool modified = false;
  for (int index = 0; index < field_count; ++index) {
    const FieldDescriptor* field = descriptor->field(index);
    std::map<std::string, Node*>::const_iterator it =
        node->children.find(field->name());
    if (it == node->children.end()) {
      if (field->is_repeated()) {
        if (reflection->FieldSize(*message, field) != 0) {
          modified = true;
        }
      } else {
        if (reflection->HasField(*message, field)) {
          modified = true;
        }
      }
      reflection->ClearField(message, field);
    } else {
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        Node* child = it->second;
        if (!child->children.empty() && reflection->HasField(*message, field)) {
          bool nestedMessageChanged =
              TrimMessage(child, reflection->MutableMessage(message, field));
          modified = nestedMessageChanged || modified;
        }
      }
    }
  }
  return modified;
}